

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionTypeParser.cpp
# Opt level: O0

InversionType * __thiscall
OpenMD::InversionTypeParser::parseLine(InversionTypeParser *this,string *line)

{
  int iVar1;
  InversionTypeEnum IVar2;
  undefined8 uVar3;
  allocator<char> *__a;
  RealType RVar4;
  __type_conflict _Var5;
  RealType phi0;
  RealType d0;
  RealType degreesPerRadian;
  RealType v2;
  ImproperCosineInversionParameter currParam;
  int i;
  vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
  parameters;
  int nSets;
  InversionTypeEnum it;
  int nTokens;
  InversionType *inversionType;
  StringTokenizer tokenizer;
  undefined8 in_stack_fffffffffffffd38;
  int __y;
  StringTokenizer *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  string *msg;
  StringTokenizer *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  StringTokenizer *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  char *__s;
  StringTokenizer *in_stack_fffffffffffffd80;
  StringTokenizer *in_stack_fffffffffffffde8;
  string local_1e9;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  undefined1 local_1aa;
  char local_1a9 [33];
  RealType local_188;
  undefined1 local_17a;
  RealType local_158;
  int local_150;
  double local_148;
  int local_13c;
  int local_120;
  undefined1 local_11a;
  string local_f8 [16];
  vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
  *in_stack_ffffffffffffff18;
  ImproperCosineInversionType *in_stack_ffffffffffffff20;
  HarmonicInversionType *local_a8;
  allocator<char> local_89;
  string local_88 [136];
  
  __y = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffd80->tokenString_,(char *)in_stack_fffffffffffffd78,
             (allocator<char> *)in_stack_fffffffffffffd70);
  StringTokenizer::StringTokenizer
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  iVar1 = StringTokenizer::countTokens(in_stack_fffffffffffffd50);
  if (iVar1 < 1) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffffd80->tokenString_,(char *)in_stack_fffffffffffffd78,
               (allocator<char> *)in_stack_fffffffffffffd70);
    OpenMDException::OpenMDException
              ((OpenMDException *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    __cxa_throw(uVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffde8);
  IVar2 = getInversionTypeEnum
                    ((InversionTypeParser *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(local_f8);
  iVar1 = iVar1 + -1;
  switch(IVar2) {
  case itImproperCosine:
    if ((iVar1 < 3) || (iVar1 % 3 != 0)) {
      local_11a = 1;
      uVar3 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffd80->tokenString_,(char *)in_stack_fffffffffffffd78,
                 (allocator<char> *)in_stack_fffffffffffffd70);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      local_11a = 0;
      __cxa_throw(uVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_120 = iVar1 / 3;
    std::
    vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
    ::vector((vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
              *)0x2adebb);
    for (local_13c = 0; local_13c < local_120; local_13c = local_13c + 1) {
      local_158 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffd80);
      local_150 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffd60);
      RVar4 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffd80);
      local_148 = (RVar4 / 180.0) * 3.141592653589793;
      std::
      vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
      ::push_back((vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                   *)in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
    }
    local_a8 = (HarmonicInversionType *)operator_new(0x38);
    ImproperCosineInversionType::ImproperCosineInversionType
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::
    vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
    ::~vector((vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
               *)in_stack_fffffffffffffd50);
    break;
  case itHarmonic:
    if (iVar1 < 2) {
      local_1aa = 1;
      __a = (allocator<char> *)__cxa_allocate_exception(0x28);
      __s = local_1a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffd80->tokenString_,__s,__a);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      local_1aa = 0;
      __cxa_throw(__a,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_1b8 = 57.29577951308232;
    RVar4 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffd80);
    _Var5 = std::pow<double,int>((double)in_stack_fffffffffffffd40,__y);
    local_1c0 = RVar4 * _Var5;
    RVar4 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffd80);
    local_1c8 = RVar4 / local_1b8;
    local_a8 = (HarmonicInversionType *)operator_new(0x18);
    HarmonicInversionType::HarmonicInversionType
              (local_a8,(RealType)in_stack_fffffffffffffd48,(RealType)in_stack_fffffffffffffd40);
    break;
  case itAmberImproper:
    if (iVar1 < 1) {
      local_17a = 1;
      uVar3 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffd80->tokenString_,(char *)in_stack_fffffffffffffd78,
                 (allocator<char> *)in_stack_fffffffffffffd70);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      local_17a = 0;
      __cxa_throw(uVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_188 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffd80);
    local_a8 = (HarmonicInversionType *)operator_new(0x40);
    AmberImproperTorsionType::AmberImproperTorsionType
              ((AmberImproperTorsionType *)in_stack_fffffffffffffd60,
               (RealType)in_stack_fffffffffffffd58);
    break;
  case itUnknown:
  default:
    uVar3 = __cxa_allocate_exception(0x28);
    msg = &local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffffd80->tokenString_,(char *)in_stack_fffffffffffffd78,
               (allocator<char> *)in_stack_fffffffffffffd70);
    OpenMDException::OpenMDException((OpenMDException *)in_stack_fffffffffffffd50,msg);
    __cxa_throw(uVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffd40);
  return &local_a8->super_InversionType;
}

Assistant:

InversionType* InversionTypeParser::parseLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    InversionType* inversionType = NULL;

    int nTokens = tokenizer.countTokens();

    if (nTokens < 1) {
      throw OpenMDException("InversionTypeParser: Not enough tokens");
    }

    InversionTypeEnum it = getInversionTypeEnum(tokenizer.nextToken());

    nTokens -= 1;

    switch (it) {
    case itImproperCosine:

      if (nTokens < 3 || nTokens % 3 != 0) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {
        int nSets = nTokens / 3;

        std::vector<ImproperCosineInversionParameter> parameters;
        for (int i = 0; i < nSets; ++i) {
          ImproperCosineInversionParameter currParam;
          currParam.kchi  = tokenizer.nextTokenAsDouble();
          currParam.n     = tokenizer.nextTokenAsInt();
          currParam.delta = tokenizer.nextTokenAsDouble() / 180.0 *
                            Constants::PI;  // convert to rad
          parameters.push_back(currParam);
        }
        inversionType = new ImproperCosineInversionType(parameters);
      }

      break;

    case itAmberImproper:

      if (nTokens < 1) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {
        RealType v2   = tokenizer.nextTokenAsDouble();
        inversionType = new AmberImproperTorsionType(v2);
      }

      break;

    case itHarmonic:
      if (nTokens < 2) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {
        // Most inversion don't have specific angle information since
        // they are cosine polynomials.  This one is different,
        // however.  To match our other force field files
        // (particularly for bends):
        //
        // d0 should be read in kcal / mol / degrees^2
        // phi0 should be read in degrees

        RealType degreesPerRadian = 180.0 / Constants::PI;

        // convert to kcal / mol / radians^2
        RealType d0 = tokenizer.nextTokenAsDouble() * pow(degreesPerRadian, 2);

        // convert to radians
        RealType phi0 = tokenizer.nextTokenAsDouble() / degreesPerRadian;
        inversionType = new HarmonicInversionType(d0, phi0);
      }
      break;

      /*
    case itCentralAtomHeight :
      if (nTokens < 1) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {

        RealType k = tokenizer.nextTokenAsDouble();

        inversionType = new CentralAtomHeightInversionType(k);
      }
      break;
    case itDreiding :
      if (nTokens < 3) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {

        RealType k = tokenizer.nextTokenAsDouble();

        inversionType = new CentralAtomHeightInversionType(k);
      }
      break;
      */
    case itUnknown:
    default:
      throw OpenMDException("InversionTypeParser: Unknown Inversion Type");
    }
    return inversionType;
  }